

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void __thiscall Z80::OpCode_POP(Z80 *this)

{
  long lVar1;
  bool bVar2;
  Z80Reg ZVar3;
  char **ppcVar4;
  long lVar5;
  Z80Reg local_88 [30];
  
  ppcVar4 = (char **)this;
  if (DAT_0018a509 == '\0') {
    do {
      ZVar3 = GetRegister(ppcVar4);
      OpCode_POPone(ZVar3);
      ppcVar4 = &lp;
      bVar2 = relaxedMaComma(&lp);
    } while (bVar2);
  }
  else {
    lVar1 = 1;
    do {
      lVar5 = lVar1;
      ZVar3 = GetRegister((char **)this);
      local_88[lVar5 + -1] = ZVar3;
      ZVar3 = GetRegister_r16Low(ZVar3);
      if ((ZVar3 == Z80_UNK) || (lVar5 == 0x1e)) break;
      ppcVar4 = &lp;
      bVar2 = relaxedMaComma(&lp);
      lVar1 = lVar5 + 1;
      this = (Z80 *)ppcVar4;
    } while (bVar2);
    for (; 0 < lVar5; lVar5 = lVar5 + -1) {
      OpCode_POPone(local_88[lVar5 + -1]);
    }
  }
  return;
}

Assistant:

static void OpCode_POP() {
		if (Options::syx.IsReversePOP) OpCode_POPreverse();
		else OpCode_POPnormal();
	}